

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegExpConstructor.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::JavascriptRegExpConstructor::HasPropertyQuery
          (JavascriptRegExpConstructor *this,PropertyId propertyId,PropertyValueInfo *info)

{
  PropertyValueInfo *info_local;
  PropertyId propertyId_local;
  JavascriptRegExpConstructor *this_local;
  
  if ((propertyId - 0x1d0U < 0x10) || (propertyId - 0x1e3U < 4)) {
    this_local._4_4_ = Property_Found;
  }
  else {
    this_local._4_4_ =
         JavascriptFunction::HasPropertyQuery((JavascriptFunction *)this,propertyId,info);
  }
  return this_local._4_4_;
}

Assistant:

PropertyQueryFlags JavascriptRegExpConstructor::HasPropertyQuery(PropertyId propertyId, _Inout_opt_ PropertyValueInfo* info)
    {
        switch (propertyId)
        {
        case PropertyIds::lastMatch:
        case PropertyIds::$Ampersand:
        case PropertyIds::lastParen:
        case PropertyIds::$Plus:
        case PropertyIds::leftContext:
        case PropertyIds::$BackTick:
        case PropertyIds::rightContext:
        case PropertyIds::$Tick:
        case PropertyIds::index:
        case PropertyIds::input:
        case PropertyIds::$_:
        case PropertyIds::$1:
        case PropertyIds::$2:
        case PropertyIds::$3:
        case PropertyIds::$4:
        case PropertyIds::$5:
        case PropertyIds::$6:
        case PropertyIds::$7:
        case PropertyIds::$8:
        case PropertyIds::$9:
            return PropertyQueryFlags::Property_Found;
        default:
            return JavascriptFunction::HasPropertyQuery(propertyId, info);
        }
    }